

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

char * imap_atom(char *str)

{
  byte bVar1;
  char cVar2;
  byte *pbVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  if (str == (char *)0x0) {
    return (char *)0x0;
  }
  lVar7 = 0;
  lVar8 = 0;
  bVar9 = false;
  pbVar3 = (byte *)str;
  do {
    bVar1 = *pbVar3;
    if (bVar1 < 0x22) {
      if (bVar1 == 0x20) {
        bVar9 = true;
      }
      else if (bVar1 == 0) {
        if ((lVar7 == 0 && lVar8 == 0) && (!bVar9)) {
          pcVar5 = (*Curl_cstrdup)(str);
          return pcVar5;
        }
        sVar4 = strlen(str);
        lVar7 = (ulong)bVar9 * 2 + lVar8 + lVar7;
        pcVar5 = (char *)(*Curl_cmalloc)(sVar4 + lVar7 + 1);
        if (pcVar5 == (char *)0x0) {
          return (char *)0x0;
        }
        lVar7 = lVar7 + sVar4;
        pcVar6 = pcVar5;
        if (bVar9 == false) goto LAB_00126f7f;
        *pcVar5 = '\"';
        pcVar5[lVar7 + -1] = '\"';
        do {
          pcVar6 = pcVar6 + 1;
LAB_00126f7f:
          cVar2 = *str;
          if ((cVar2 == '\"') || (cVar2 == '\\')) {
            *pcVar6 = '\\';
            pcVar6 = pcVar6 + 1;
          }
          else if (cVar2 == '\0') {
            pcVar5[lVar7] = '\0';
            return pcVar5;
          }
          *pcVar6 = *str;
          str = str + 1;
        } while( true );
      }
    }
    else if (bVar1 == 0x22) {
      lVar8 = lVar8 + 1;
    }
    else if (bVar1 == 0x5c) {
      lVar7 = lVar7 + 1;
    }
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

static char *imap_atom(const char *str)
{
  const char *p1;
  char *p2;
  size_t backsp_count = 0;
  size_t quote_count = 0;
  bool space_exists = FALSE;
  size_t newlen = 0;
  char *newstr = NULL;

  if(!str)
    return NULL;

  /* Count any unescapped characters */
  p1 = str;
  while(*p1) {
    if(*p1 == '\\')
      backsp_count++;
    else if(*p1 == '"')
      quote_count++;
    else if(*p1 == ' ')
      space_exists = TRUE;

    p1++;
  }

  /* Does the input contain any unescapped characters? */
  if(!backsp_count && !quote_count && !space_exists)
    return strdup(str);

  /* Calculate the new string length */
  newlen = strlen(str) + backsp_count + quote_count + (space_exists ? 2 : 0);

  /* Allocate the new string */
  newstr = (char *) malloc((newlen + 1) * sizeof(char));
  if(!newstr)
    return NULL;

  /* Surround the string in quotes if necessary */
  p2 = newstr;
  if(space_exists) {
    newstr[0] = '"';
    newstr[newlen - 1] = '"';
    p2++;
  }

  /* Copy the string, escaping backslash and quote characters along the way */
  p1 = str;
  while(*p1) {
    if(*p1 == '\\' || *p1 == '"') {
      *p2 = '\\';
      p2++;
    }

   *p2 = *p1;

    p1++;
    p2++;
  }

  /* Terminate the string */
  newstr[newlen] = '\0';

  return newstr;
}